

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O0

uintptr_t make_string(File *fp,char *name)

{
  char *__dest;
  size_t sVar1;
  char *dest;
  Buf *buf;
  intptr_t size;
  char *name_local;
  File *fp_local;
  
  sVar1 = strlen(name);
  make_room_in_buf(&fp->strings,sVar1 + 1);
  __dest = (fp->strings).cur;
  strcpy(__dest,name);
  (fp->strings).cur = (fp->strings).cur + sVar1 + 1;
  return (long)__dest - (long)(fp->strings).start;
}

Assistant:

static uintptr_t make_string(File *fp, const char *name) {
  intptr_t size = strlen(name) + 1;
  Buf *buf = &fp->strings;
  char *dest;
  make_room_in_buf(buf, size);
  dest = buf->cur;
  strcpy(dest, name);
  buf->cur += size;
  return dest - buf->start;
}